

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::Sweep(HeapInfo *this,RecyclerSweep *recyclerSweep,bool concurrent)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  undefined8 *in_FS_OFFSET;
  
  if ((int)CONCAT71(in_register_00000011,concurrent) == 0) {
    SweepSmallNonFinalizable(this,recyclerSweep);
  }
  else {
    GetSmallHeapBlockCount(this,true);
    GetLargeHeapBlockCount(this,true);
    SetupBackgroundSweep(this,recyclerSweep);
  }
  LargeHeapBucket::Sweep(&this->largeObjectBucket,recyclerSweep);
  GetLargeHeapBlockCount(this,true);
  if (this->newFinalizableObjectCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x42b,"(this->newFinalizableObjectCount == 0)",
                       "this->newFinalizableObjectCount == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
HeapInfo::Sweep(RecyclerSweep& recyclerSweep, bool concurrent)
{
    RECYCLER_PROFILE_EXEC_BEGIN(recyclerSweep.GetRecycler(), Js::SweepSmallPhase);

#if ENABLE_CONCURRENT_GC
    if (concurrent)
    {
        RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
        RECYCLER_SLOW_CHECK(VerifyLargeHeapBlockCount());
    }

    if (concurrent)
    {
        this->SetupBackgroundSweep(recyclerSweep);
    }
    else
#endif
    {
        this->SweepSmallNonFinalizable(recyclerSweep);
    }

    RECYCLER_PROFILE_EXEC_CHANGE(recyclerSweep.GetRecycler(), Js::SweepSmallPhase, Js::SweepLargePhase);

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !(SMALLBLOCK_MEDIUM_ALLOC)
    // CONCURRENT-TODO: Allow this in the background as well
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Sweep(recyclerSweep);
    }
#endif
    largeObjectBucket.Sweep(recyclerSweep);

    RECYCLER_PROFILE_EXEC_END(recyclerSweep.GetRecycler(), Js::SweepLargePhase);

    RECYCLER_SLOW_CHECK(VerifyLargeHeapBlockCount());
    RECYCLER_SLOW_CHECK(Assert(this->newFinalizableObjectCount == 0));
}